

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O3

void __thiscall
cubeb_duplex_collection_change_no_unregister_Test::
~cubeb_duplex_collection_change_no_unregister_Test
          (cubeb_duplex_collection_change_no_unregister_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cubeb, duplex_collection_change_no_unregister)
{
  cubeb * ctx;
  int r;

  r = common_init(&ctx, "Cubeb duplex example with collection change");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";
  std::unique_ptr<cubeb, decltype(&cubeb_destroy)> cleanup_cubeb_at_exit(
      ctx, [](cubeb * p) noexcept { EXPECT_DEATH(cubeb_destroy(p), ""); });

  duplex_collection_change_impl(ctx);
}